

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

UdpInitialStmtSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UdpInitialStmtSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,ExpressionSyntax *args_3,
          Token *args_4)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  TokenKind TVar17;
  undefined1 uVar18;
  NumericTokenFlags NVar19;
  uint32_t uVar20;
  UdpInitialStmtSyntax *pUVar21;
  
  pUVar21 = (UdpInitialStmtSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((UdpInitialStmtSyntax *)this->endPtr < pUVar21 + 1) {
    pUVar21 = (UdpInitialStmtSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pUVar21 + 1);
  }
  TVar5 = args->kind;
  uVar6 = args->field_0x2;
  NVar7.raw = (args->numFlags).raw;
  uVar8 = args->rawLen;
  pIVar1 = args->info;
  TVar9 = args_1->kind;
  uVar10 = args_1->field_0x2;
  NVar11.raw = (args_1->numFlags).raw;
  uVar12 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar13 = args_2->kind;
  uVar14 = args_2->field_0x2;
  NVar15.raw = (args_2->numFlags).raw;
  uVar16 = args_2->rawLen;
  pIVar3 = args_2->info;
  TVar17 = args_4->kind;
  uVar18 = args_4->field_0x2;
  NVar19.raw = (args_4->numFlags).raw;
  uVar20 = args_4->rawLen;
  pIVar4 = args_4->info;
  (pUVar21->super_SyntaxNode).kind = UdpInitialStmt;
  (pUVar21->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pUVar21->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pUVar21->initial).kind = TVar5;
  (pUVar21->initial).field_0x2 = uVar6;
  (pUVar21->initial).numFlags = (NumericTokenFlags)NVar7.raw;
  (pUVar21->initial).rawLen = uVar8;
  (pUVar21->initial).info = pIVar1;
  (pUVar21->name).kind = TVar9;
  (pUVar21->name).field_0x2 = uVar10;
  (pUVar21->name).numFlags = (NumericTokenFlags)NVar11.raw;
  (pUVar21->name).rawLen = uVar12;
  (pUVar21->name).info = pIVar2;
  (pUVar21->equals).kind = TVar13;
  (pUVar21->equals).field_0x2 = uVar14;
  (pUVar21->equals).numFlags = (NumericTokenFlags)NVar15.raw;
  (pUVar21->equals).rawLen = uVar16;
  (pUVar21->equals).info = pIVar3;
  (pUVar21->value).ptr = args_3;
  (pUVar21->semi).kind = TVar17;
  (pUVar21->semi).field_0x2 = uVar18;
  (pUVar21->semi).numFlags = (NumericTokenFlags)NVar19.raw;
  (pUVar21->semi).rawLen = uVar20;
  (pUVar21->semi).info = pIVar4;
  (args_3->super_SyntaxNode).parent = &pUVar21->super_SyntaxNode;
  return pUVar21;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }